

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# banner.cpp
# Opt level: O0

void OutputBanner(ofstream *ostream,Banner *banner)

{
  const_iterator pvVar1;
  const_iterator pvVar2;
  const_iterator pvVar3;
  const_iterator pvVar4;
  const_iterator pvVar5;
  char16_t c_5;
  const_iterator __end1_9;
  const_iterator __begin1_9;
  array<unsigned_short,_128UL> *__range1_9;
  char16_t c_4;
  const_iterator __end1_8;
  const_iterator __begin1_8;
  array<unsigned_short,_128UL> *__range1_8;
  char16_t c_3;
  const_iterator __end1_7;
  const_iterator __begin1_7;
  array<unsigned_short,_128UL> *__range1_7;
  char16_t c_2;
  const_iterator __end1_6;
  const_iterator __begin1_6;
  array<unsigned_short,_128UL> *__range1_6;
  char16_t c_1;
  const_iterator __end1_5;
  const_iterator __begin1_5;
  array<unsigned_short,_128UL> *__range1_5;
  char16_t c;
  const_iterator __end1_4;
  const_iterator __begin1_4;
  array<unsigned_short,_128UL> *__range1_4;
  u8 i_3;
  const_iterator __end1_3;
  const_iterator __begin1_3;
  IconPalette *__range1_3;
  u8 i_2;
  const_iterator __end1_2;
  const_iterator __begin1_2;
  IconBitmap *__range1_2;
  u8 i_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  array<unsigned_char,_22UL> *__range1_1;
  u16 i;
  const_iterator __end1;
  const_iterator __begin1;
  array<unsigned_short,_3UL> *__range1;
  Banner *banner_local;
  ofstream *ostream_local;
  
  SerializeData<unsigned_short>(ostream,banner->version);
  SerializeData<unsigned_short>(ostream,banner->crc);
  __end1 = std::array<unsigned_short,_3UL>::begin(&banner->crc_padding);
  pvVar1 = std::array<unsigned_short,_3UL>::end(&banner->crc_padding);
  for (; __end1 != pvVar1; __end1 = __end1 + 1) {
    SerializeData<unsigned_short>(ostream,0);
  }
  __end1_1 = std::array<unsigned_char,_22UL>::begin(&banner->padding);
  pvVar2 = std::array<unsigned_char,_22UL>::end(&banner->padding);
  for (; __end1_1 != pvVar2; __end1_1 = __end1_1 + 1) {
    SerializeData<unsigned_char>(ostream,'\0');
  }
  __end1_2 = std::array<unsigned_char,_512UL>::begin(&banner->bitmap);
  pvVar3 = std::array<unsigned_char,_512UL>::end(&banner->bitmap);
  for (; __end1_2 != pvVar3; __end1_2 = __end1_2 + 1) {
    SerializeData<unsigned_char>(ostream,*__end1_2);
  }
  __end1_3 = std::array<unsigned_char,_32UL>::begin(&banner->palette);
  pvVar4 = std::array<unsigned_char,_32UL>::end(&banner->palette);
  for (; __end1_3 != pvVar4; __end1_3 = __end1_3 + 1) {
    SerializeData<unsigned_char>(ostream,*__end1_3);
  }
  __end1_4 = std::array<unsigned_short,_128UL>::begin(&banner->japanese_title);
  pvVar5 = std::array<unsigned_short,_128UL>::end(&banner->japanese_title);
  for (; __end1_4 != pvVar5; __end1_4 = __end1_4 + 1) {
    SerializeData<unsigned_short>(ostream,*__end1_4);
  }
  __end1_5 = std::array<unsigned_short,_128UL>::begin(&banner->english_title);
  pvVar5 = std::array<unsigned_short,_128UL>::end(&banner->english_title);
  for (; __end1_5 != pvVar5; __end1_5 = __end1_5 + 1) {
    SerializeData<unsigned_short>(ostream,*__end1_5);
  }
  __end1_6 = std::array<unsigned_short,_128UL>::begin(&banner->french_title);
  pvVar5 = std::array<unsigned_short,_128UL>::end(&banner->french_title);
  for (; __end1_6 != pvVar5; __end1_6 = __end1_6 + 1) {
    SerializeData<unsigned_short>(ostream,*__end1_6);
  }
  __end1_7 = std::array<unsigned_short,_128UL>::begin(&banner->german_title);
  pvVar5 = std::array<unsigned_short,_128UL>::end(&banner->german_title);
  for (; __end1_7 != pvVar5; __end1_7 = __end1_7 + 1) {
    SerializeData<unsigned_short>(ostream,*__end1_7);
  }
  __end1_8 = std::array<unsigned_short,_128UL>::begin(&banner->italian_title);
  pvVar5 = std::array<unsigned_short,_128UL>::end(&banner->italian_title);
  for (; __end1_8 != pvVar5; __end1_8 = __end1_8 + 1) {
    SerializeData<unsigned_short>(ostream,*__end1_8);
  }
  __end1_9 = std::array<unsigned_short,_128UL>::begin(&banner->spanish_title);
  pvVar5 = std::array<unsigned_short,_128UL>::end(&banner->spanish_title);
  for (; __end1_9 != pvVar5; __end1_9 = __end1_9 + 1) {
    SerializeData<unsigned_short>(ostream,*__end1_9);
  }
  return;
}

Assistant:

void OutputBanner(std::ofstream& ostream, const Banner& banner) {
    SerializeData<u16>(ostream, banner.version);
    SerializeData<u16>(ostream, banner.crc);

    for ([[maybe_unused]] u16 i : banner.crc_padding) {
        SerializeData<u16>(ostream, 0);
    }

    for ([[maybe_unused]] u8 i : banner.padding) {
        SerializeData<u8>(ostream, 0);
    }

    for (u8 i : banner.bitmap) {
        SerializeData<u8>(ostream, i);
    }

    for (u8 i : banner.palette) {
        SerializeData<u8>(ostream, i);
    }

    for (char16_t c : banner.japanese_title) {
        SerializeData<u16>(ostream, c);
    }

    for (char16_t c : banner.english_title) {
        SerializeData<u16>(ostream, c);
    }

    for (char16_t c : banner.french_title) {
        SerializeData<u16>(ostream, c);
    }

    for (char16_t c : banner.german_title) {
        SerializeData<u16>(ostream, c);
    }

    for (char16_t c : banner.italian_title) {
        SerializeData<u16>(ostream, c);
    }

    for (char16_t c : banner.spanish_title) {
        SerializeData<u16>(ostream, c);
    }
}